

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

reference __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::operator[](InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             *this,size_type i)

{
  ulong uVar1;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_00;
  reference extraout_RAX;
  reference extraout_RAX_00;
  reference pVVar2;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar3;
  
  uVar1 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (i < uVar1 >> 1) {
    if ((uVar1 & 1) == 0) {
      pPVar3 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
               &(this->storage_).data_;
    }
    else {
      pPVar3 = (this->storage_).data_.allocated.allocated_data;
    }
    return pPVar3 + i;
  }
  InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>
  ::operator[]();
  this_00 = (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             *)(this->storage_).metadata_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
               .super_Storage<unsigned_long,_1UL,_false>.value;
  pVVar2 = extraout_RAX;
  if (this_00 !=
      (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
       *)0x0) {
    inlined_vector_internal::
    Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
    ::~Storage(this_00);
    operator_delete(this_00,0x38);
    pVVar2 = extraout_RAX_00;
  }
  (this->storage_).metadata_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value = 0;
  return pVVar2;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }